

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O1

Status __thiscall leveldb::anon_unknown_0::MergingIterator::status(MergingIterator *this)

{
  long in_RSI;
  long lVar1;
  long lVar2;
  _func_int **local_30;
  
  (this->super_Iterator)._vptr_Iterator = (_func_int **)0x0;
  if (*(int *)(in_RSI + 0x38) < 1) {
    local_30 = (_func_int **)0x0;
  }
  else {
    lVar1 = 0;
    lVar2 = 0;
    do {
      (**(code **)(**(long **)(*(long *)(in_RSI + 0x30) + lVar1) + 0x50))(&local_30);
      if (local_30 != (_func_int **)0x0) break;
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x20;
    } while (lVar2 < *(int *)(in_RSI + 0x38));
  }
  (this->super_Iterator)._vptr_Iterator = local_30;
  return (Status)(char *)this;
}

Assistant:

Status status() const override {
    Status status;
    for (int i = 0; i < n_; i++) {
      status = children_[i].status();
      if (!status.ok()) {
        break;
      }
    }
    return status;
  }